

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_QFileAction.cpp
# Opt level: O0

int __thiscall QFileAction::qt_metacall(QFileAction *this,Call _c,int _id,void **_a)

{
  QObject *in_RCX;
  uint in_EDX;
  int in_ESI;
  void **in_RDI;
  int in_stack_ffffffffffffffd8;
  Call in_stack_ffffffffffffffdc;
  int local_18;
  int local_4;
  
  local_18 = QAction::qt_metacall((Call)in_RDI,in_ESI,(void **)(ulong)in_EDX);
  local_4 = local_18;
  if (-1 < local_18) {
    if (in_ESI == 0) {
      if (local_18 < 1) {
        qt_static_metacall(in_RCX,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8,in_RDI);
      }
      local_18 = local_18 + -1;
    }
    else if (in_ESI == 7) {
      if (local_18 < 1) {
        memset(&stack0xffffffffffffffd8,0,8);
        QMetaType::QMetaType((QMetaType *)&stack0xffffffffffffffd8);
        **(undefined8 **)in_RCX = CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
      }
      local_18 = local_18 + -1;
    }
    local_4 = local_18;
  }
  return local_4;
}

Assistant:

int QFileAction::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QAction::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 1)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 1;
    } else if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 1)
            *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType();
        _id -= 1;
    }
    return _id;
}